

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O3

void If_DsdManHashProfile(If_DsdMan_t *p)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  
  if (0 < (long)p->nBins) {
    lVar2 = 0;
    do {
      uVar3 = p->pBins[lVar2];
      while (uVar3 != 0) {
        if (((int)uVar3 < 0) || ((p->vObjs).nSize <= (int)uVar3)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        iVar1 = *(p->vObjs).pArray[uVar3];
        if (((long)iVar1 < 0) || ((p->vNexts).nSize <= iVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        uVar3 = (p->vNexts).pArray[iVar1];
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != p->nBins);
  }
  return;
}

Assistant:

void If_DsdManHashProfile( If_DsdMan_t * p )
{
    If_DsdObj_t * pObj;
    unsigned * pSpot;
    int i, Counter;
    for ( i = 0; i < p->nBins; i++ )
    {
        Counter = 0;
        for ( pSpot = p->pBins + i; *pSpot; pSpot = (unsigned *)Vec_IntEntryP(&p->vNexts, pObj->Id), Counter++ )
             pObj = If_DsdVecObj( &p->vObjs, *pSpot );
//        if ( Counter > 5 )
//            printf( "%d ", Counter );
//        if ( i > 10000 )
//            break;
    }
//    printf( "\n" );
}